

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O1

string * anon_unknown.dwarf_324f7::config_var_name
                   (string *__return_storage_ptr__,string *name,string *key)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  size_type sVar10;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"CALI_","");
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_48,(ulong)(name->_M_dataplus)._M_p)
  ;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_78 = *puVar7;
    uStack_70 = (undefined4)plVar5[3];
    uStack_6c = *(undefined4 *)((long)plVar5 + 0x1c);
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar7;
    local_88 = (ulong *)*plVar5;
  }
  local_80 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"_","");
  uVar9 = 0xf;
  if (local_88 != &local_78) {
    uVar9 = local_78;
  }
  if (uVar9 < (ulong)(local_60 + local_80)) {
    uVar9 = 0xf;
    if (local_68 != local_58) {
      uVar9 = local_58[0];
    }
    if ((ulong)(local_60 + local_80) <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_0018b42d;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68);
LAB_0018b42d:
  local_a8 = &local_98;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_98 = *plVar5;
    uStack_90 = puVar6[3];
  }
  else {
    local_98 = *plVar5;
    local_a8 = (long *)*puVar6;
  }
  local_a0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(key->_M_dataplus)._M_p)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  sVar1 = __return_storage_ptr__->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar10 = 0;
    do {
      iVar4 = toupper((int)pcVar2[sVar10]);
      pcVar2[sVar10] = (char)iVar4;
      sVar10 = sVar10 + 1;
    } while (sVar1 != sVar10);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string config_var_name(const std::string& name, const std::string& key)
{
    // make uppercase PREFIX_NAMESPACE_KEY string

    std::string str = std::string("CALI_") + name + std::string("_") + key;
    std::transform(str.begin(), str.end(), str.begin(), ::toupper);

    return str;
}